

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer puVar1;
  pointer *ppuVar2;
  gzFile_s gVar3;
  Sequence *pSVar4;
  _Alloc_hider _Var5;
  pointer ppEVar6;
  uint *puVar7;
  bool bVar8;
  pointer puVar9;
  undefined8 uVar10;
  pointer pbVar11;
  pointer puVar12;
  int32_t iVar13;
  undefined8 this;
  pointer puVar14;
  size_type sVar15;
  int32_t iVar16;
  int iVar17;
  uint32_t uVar18;
  uint uVar19;
  undefined8 extraout_RAX;
  undefined7 uVar24;
  pointer ppNVar20;
  ostream *poVar21;
  Node *pNVar22;
  uint *puVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  pointer puVar26;
  ulong uVar27;
  long lVar28;
  unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *it;
  pointer puVar29;
  undefined8 uVar30;
  char *pcVar31;
  unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_> *it_1;
  pointer puVar32;
  _Head_base<0UL,_gzFile_s_*,_false> _Var33;
  pointer *ppiVar34;
  ulong uVar35;
  Edge **jt;
  pointer ppEVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  initializer_list<unsigned_char> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  string name;
  long local_288;
  ulong local_278;
  int local_26c;
  string local_268;
  undefined1 local_248 [16];
  _Head_base<0UL,_gzFile_s_*,_false> local_238;
  undefined1 local_230 [8];
  pointer local_228;
  _Bit_type *******local_220;
  uint local_218;
  _Bit_pointer local_210;
  undefined1 local_208 [16];
  _Head_base<0UL,_biosoup::Sequence_*,_false> local_1f8 [2];
  int32_t local_1e4;
  int local_1e0;
  AlignmentType local_1dc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  ulong local_1b0;
  ulong local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> results;
  int32_t score;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  Graph graph;
  string dot_path;
  string optstr;
  int32_t score_rev;
  undefined8 local_68;
  undefined4 local_60;
  undefined2 uStack_5c;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  string local_50;
  
  graph._0_8_ = graph._0_8_ & 0xffffffffffffff00;
  __l._M_len = 1;
  __l._M_array = (iterator)&graph;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&results,__l,(allocator_type *)&name);
  dot_path._M_dataplus._M_p = (pointer)&dot_path.field_2;
  paVar25 = &optstr.field_2;
  dot_path._M_string_length = 0;
  dot_path.field_2._M_local_buf[0] = '\0';
  optstr._M_dataplus._M_p = (pointer)paVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)&optstr,"m:n:g:e:q:c:l:r:d:sh","");
  uVar24 = (undefined7)((ulong)extraout_RAX >> 8);
  local_1e4 = -1;
  local_1dc = kSW;
  local_278 = CONCAT71(uVar24,5) & 0xffffffff;
  local_1e0 = (int)CONCAT71((int7)((ulong)paVar25 >> 8),0xfc);
  local_1a8 = CONCAT71(uVar24,0xf8) & 0xffffffff;
  local_238._M_head_impl._0_4_ = (int)CONCAT71(uVar24,0xfa);
  local_1b0 = CONCAT71(uVar24,0xf6) & 0xffffffff;
  local_26c = (int)CONCAT71(uVar24,0xfc);
  bVar37 = false;
  do {
    bVar8 = bVar37;
    iVar17 = getopt_long(argc,argv,optstr._M_dataplus._M_p,(anonymous_namespace)::options,0);
    sVar15 = dot_path._M_string_length;
    pcVar31 = _optarg;
    bVar37 = true;
    switch(iVar17) {
    case 99:
      local_26c = atoi(_optarg);
      bVar37 = bVar8;
      break;
    case 100:
      strlen(_optarg);
      std::__cxx11::string::_M_replace((ulong)&dot_path,0,(char *)sVar15,(ulong)pcVar31);
      bVar37 = bVar8;
      break;
    case 0x65:
      iVar17 = atoi(_optarg);
      local_238._M_head_impl._0_4_ = iVar17;
      bVar37 = bVar8;
      break;
    case 0x66:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6f:
    case 0x70:
    case 0x74:
    case 0x75:
switchD_001037ea_caseD_66:
      iVar17 = 1;
LAB_00104377:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)optstr._M_dataplus._M_p != &optstr.field_2) {
        operator_delete(optstr._M_dataplus._M_p,optstr.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dot_path._M_dataplus._M_p != &dot_path.field_2) {
        operator_delete(dot_path._M_dataplus._M_p,
                        CONCAT71(dot_path.field_2._M_allocated_capacity._1_7_,
                                 dot_path.field_2._M_local_buf[0]) + 1);
      }
      if (results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)results.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)results.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return iVar17;
    case 0x67:
      uVar19 = atoi(_optarg);
      local_1a8 = (ulong)uVar19;
      bVar37 = bVar8;
      break;
    case 0x68:
      iVar17 = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "usage: spoa [options ...] <sequences>\n\n  # default output is stdout\n  <sequences>\n    input file in FASTA/FASTQ format (can be compressed with gzip)\n\n  options:\n    -m <int>\n      default: 5\n      score for matching bases\n    -n <int>\n      default: -4\n      score for mismatching bases\n    -g <int>\n      default: -8\n      gap opening penalty (must be non-positive)\n    -e <int>\n      default: -6\n      gap extension penalty (must be non-positive)\n    -q <int>\n      default: -10\n      gap opening penalty of the second affine function\n      (must be non-positive)\n    -c <int>\n      default: -4\n      gap extension penalty of the second affine function\n      (must be non-positive)\n    -l, --algorithm <int>\n      default: 0\n      alignment mode:\n        0 - local (Smith-Waterman)\n        1 - global (Needleman-Wunsch)\n        2 - semi-global\n    -r, --result <int> (option can be used multiple times)\n      default: 0\n      result mode:\n        0 - consensus (FASTA)\n        1 - multiple sequence alignment (FASTA)\n        2 - 0 & 1 (FASTA)\n        3 - partial order graph (GFA)\n        4 - 0 & 3 (GFA)\n    --min-coverage <int>\n      default: -1\n      minimal consensus coverage (usable only with -r 0)\n    -d, --dot <file>\n      output file for the partial order graph in DOT format\n    -s, --strand-ambiguous\n      for each sequence pick the strand with the better alignment\n    --version\n      prints the version number\n    -h, --help\n      prints the usage\n\n  gap mode:\n    linear if g >= e\n    affine if g <= q or e >= c\n    convex otherwise (default)\n"
                 ,0x619);
      goto LAB_00104377;
    case 0x6c:
      local_1dc = atoi(_optarg);
      bVar37 = bVar8;
      break;
    case 0x6d:
      uVar19 = atoi(_optarg);
      local_278 = (ulong)uVar19;
      bVar37 = bVar8;
      break;
    case 0x6e:
      local_1e0 = atoi(_optarg);
      bVar37 = bVar8;
      break;
    case 0x71:
      uVar19 = atoi(_optarg);
      local_1b0 = (ulong)uVar19;
      bVar37 = bVar8;
      break;
    case 0x72:
      uVar18 = atoi(_optarg);
      graph.num_codes_ = uVar18;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
                (&results,(int *)&graph);
      bVar37 = bVar8;
      break;
    case 0x73:
      break;
    case 0x76:
      spoa::Version_abi_cxx11_();
      poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)graph._0_8_,
                           (long)graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
      std::ostream::put((char)poVar21);
      std::ostream::flush();
      if ((pointer *)graph._0_8_ !=
          &graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete((void *)graph._0_8_,
                        (long)graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish + 1);
      }
      iVar17 = 0;
      goto LAB_00104377;
    default:
      if (iVar17 != 0x4d) {
        if (iVar17 == -1) {
          if (1 < (ulong)((long)results.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)results.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)) {
            puVar1 = results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1;
            if (puVar1 != results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish) {
              memmove(results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,puVar1,
                      (long)results.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
            }
            results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
          }
          if (argc <= _optind) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"[spoa::] error: missing input file!",0x23);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
            std::ostream::put('(');
            std::ostream::flush();
            iVar17 = 1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "usage: spoa [options ...] <sequences>\n\n  # default output is stdout\n  <sequences>\n    input file in FASTA/FASTQ format (can be compressed with gzip)\n\n  options:\n    -m <int>\n      default: 5\n      score for matching bases\n    -n <int>\n      default: -4\n      score for mismatching bases\n    -g <int>\n      default: -8\n      gap opening penalty (must be non-positive)\n    -e <int>\n      default: -6\n      gap extension penalty (must be non-positive)\n    -q <int>\n      default: -10\n      gap opening penalty of the second affine function\n      (must be non-positive)\n    -c <int>\n      default: -4\n      gap extension penalty of the second affine function\n      (must be non-positive)\n    -l, --algorithm <int>\n      default: 0\n      alignment mode:\n        0 - local (Smith-Waterman)\n        1 - global (Needleman-Wunsch)\n        2 - semi-global\n    -r, --result <int> (option can be used multiple times)\n      default: 0\n      result mode:\n        0 - consensus (FASTA)\n        1 - multiple sequence alignment (FASTA)\n        2 - 0 & 1 (FASTA)\n        3 - partial order graph (GFA)\n        4 - 0 & 3 (GFA)\n    --min-coverage <int>\n      default: -1\n      minimal consensus coverage (usable only with -r 0)\n    -d, --dot <file>\n      output file for the partial order graph in DOT format\n    -s, --strand-ambiguous\n      for each sequence pick the strand with the better alignment\n    --version\n      prints the version number\n    -h, --help\n      prints the usage\n\n  gap mode:\n    linear if g >= e\n    affine if g <= q or e >= c\n    convex otherwise (default)\n"
                       ,0x619);
            goto LAB_00104377;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_268,argv[_optind],(allocator<char> *)(local_248 + 0xf));
          graph._0_8_ = &graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
          graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x6;
          graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)CONCAT17(graph.coder_.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish._7_1_,
                                         0x61747361662e);
          if (local_268._M_string_length < 6) {
            name.field_2._M_allocated_capacity = 0x672e61747361662e;
            name.field_2._8_2_ = 0x7a;
            name._M_string_length = 9;
            name._M_dataplus._M_p = (pointer)&name.field_2;
LAB_00103b65:
            local_230 = (undefined1  [8])&local_220;
            local_228 = (pointer)0x4;
            local_220 = (_Bit_type *******)CONCAT35(local_220._5_3_,0x616e662e);
            if (local_268._M_string_length < 4) {
              path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x7;
              path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_208._8_8_ = 4;
              local_208._0_8_ = local_1f8;
              path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x7a672e616e662e;
              local_1f8[0]._M_head_impl._0_5_ = 0x6161662e;
LAB_00103c7f:
              headers.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x7;
              headers.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&headers.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              headers.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x7a672e6161662e;
LAB_00103ca8:
              local_178 = 0x61662e;
              local_180 = 3;
              _score = &local_178;
              if (local_268._M_string_length < 3) {
                bVar37 = false;
              }
              else {
                iVar17 = std::__cxx11::string::compare
                                   ((ulong)&local_268,local_268._M_string_length - 3,(string *)0x3);
                if (iVar17 == 0) {
                  bVar37 = true;
                }
                else {
                  local_60 = 0x2e61662e;
                  uStack_5c = 0x7a67;
                  local_68 = 6;
                  uStack_5a = 0;
                  _score_rev = &local_60;
                  if (local_268._M_string_length < 6) {
                    bVar37 = false;
                  }
                  else {
                    iVar17 = std::__cxx11::string::compare
                                       ((ulong)&local_268,local_268._M_string_length - 6,
                                        (string *)0x6);
                    bVar37 = iVar17 == 0;
                    if (_score_rev != &local_60) {
                      operator_delete(_score_rev,
                                      CONCAT17(uStack_59,
                                               CONCAT16(uStack_5a,CONCAT24(uStack_5c,local_60))) + 1
                                     );
                    }
                  }
                }
              }
              if (_score != &local_178) {
                operator_delete(_score,CONCAT44(uStack_174,local_178) + 1);
              }
LAB_00103e2d:
              if (headers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&headers.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(headers.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((headers.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + 1));
              }
LAB_00103e5a:
              if ((_Head_base<0UL,_biosoup::Sequence_*,_false> *)local_208._0_8_ != local_1f8) {
                operator_delete((void *)local_208._0_8_,
                                (ulong)((long)&(local_1f8[0]._M_head_impl)->id + 1));
              }
LAB_00103e77:
              if ((pointer *)
                  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)path.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
            }
            else {
              iVar17 = std::__cxx11::string::compare
                                 ((ulong)&local_268,local_268._M_string_length - 4,(string *)0x4);
              if (iVar17 != 0) {
                path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x7;
                path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x7a672e616e662e;
                if ((local_268._M_string_length < 7) ||
                   (iVar17 = std::__cxx11::string::compare
                                       ((ulong)&local_268,local_268._M_string_length - 7,
                                        (string *)0x7), iVar17 != 0)) {
                  local_208._8_8_ = 4;
                  local_208._0_8_ = local_1f8;
                  local_1f8[0]._M_head_impl._0_5_ = 0x6161662e;
                  if (local_268._M_string_length < 4) goto LAB_00103c7f;
                  iVar17 = std::__cxx11::string::compare
                                     ((ulong)&local_268,local_268._M_string_length - 4,(string *)0x4
                                     );
                  if (iVar17 != 0) {
                    headers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x7;
                    headers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)&headers.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    headers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x7a672e6161662e;
                    if ((local_268._M_string_length < 7) ||
                       (iVar17 = std::__cxx11::string::compare
                                           ((ulong)&local_268,local_268._M_string_length - 7,
                                            (string *)0x7), iVar17 != 0)) goto LAB_00103ca8;
                    bVar37 = true;
                    goto LAB_00103e2d;
                  }
                  bVar37 = true;
                  goto LAB_00103e5a;
                }
                bVar37 = true;
                goto LAB_00103e77;
              }
              bVar37 = true;
            }
            if (local_230 != (undefined1  [8])&local_220) {
              operator_delete((void *)local_230,(long)local_220 + 1);
            }
LAB_00103eab:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            iVar17 = std::__cxx11::string::compare
                               ((ulong)&local_268,local_268._M_string_length - 6,(string *)0x6);
            if (iVar17 != 0) {
              name.field_2._M_allocated_capacity = 0x672e61747361662e;
              name.field_2._8_2_ = 0x7a;
              name._M_string_length = 9;
              name._M_dataplus._M_p = (pointer)&name.field_2;
              if ((local_268._M_string_length < 9) ||
                 (iVar17 = std::__cxx11::string::compare
                                     ((ulong)&local_268,local_268._M_string_length - 9,(string *)0x9
                                     ), iVar17 != 0)) goto LAB_00103b65;
              bVar37 = true;
              goto LAB_00103eab;
            }
            bVar37 = true;
          }
          ppiVar34 = &graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          if ((pointer *)graph._0_8_ != ppiVar34) {
            operator_delete((void *)graph._0_8_,
                            (long)graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_finish + 1);
          }
          if (bVar37) {
            bioparser::Parser<biosoup::Sequence>::Create<bioparser::FastaParser>
                      ((Parser<biosoup::Sequence> *)local_248,&local_268);
          }
          else {
            graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x6;
            graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)CONCAT17(graph.coder_.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish._7_1_,0x71747361662e);
            graph._0_8_ = ppiVar34;
            if (local_268._M_string_length < 6) {
              name.field_2._M_allocated_capacity = 0x672e71747361662e;
              name.field_2._8_2_ = 0x7a;
              name._M_string_length = 9;
              name._M_dataplus._M_p = (pointer)&name.field_2;
LAB_00103fd5:
              local_220 = (_Bit_type *******)CONCAT44(local_220._4_4_,0x71662e);
              local_228 = (pointer)0x3;
              local_230 = (undefined1  [8])&local_220;
              if (local_268._M_string_length < 3) {
LAB_00104043:
                bVar37 = false;
              }
              else {
                iVar17 = std::__cxx11::string::compare
                                   ((ulong)&local_268,local_268._M_string_length - 3,(string *)0x3);
                if (iVar17 == 0) {
                  bVar37 = true;
                }
                else {
                  ppuVar2 = &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x6;
                  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)ppuVar2;
                  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT17(path.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                                         0x7a672e71662e);
                  if (local_268._M_string_length < 6) goto LAB_00104043;
                  iVar17 = std::__cxx11::string::compare
                                     ((ulong)&local_268,local_268._M_string_length - 6,(string *)0x6
                                     );
                  bVar37 = iVar17 == 0;
                  if ((pointer *)
                      path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start != ppuVar2) {
                    operator_delete(path.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)path.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                  }
                }
              }
              if (local_230 != (undefined1  [8])&local_220) {
                operator_delete((void *)local_230,(long)local_220 + 1);
              }
LAB_001040a3:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              iVar17 = std::__cxx11::string::compare
                                 ((ulong)&local_268,local_268._M_string_length - 6,(string *)0x6);
              if (iVar17 != 0) {
                name.field_2._M_allocated_capacity = 0x672e71747361662e;
                name.field_2._8_2_ = 0x7a;
                name._M_string_length = 9;
                name._M_dataplus._M_p = (pointer)&name.field_2;
                if ((local_268._M_string_length < 9) ||
                   (iVar17 = std::__cxx11::string::compare
                                       ((ulong)&local_268,local_268._M_string_length - 9,
                                        (string *)0x9), iVar17 != 0)) goto LAB_00103fd5;
                bVar37 = true;
                goto LAB_001040a3;
              }
              bVar37 = true;
            }
            if ((pointer *)graph._0_8_ != ppiVar34) {
              operator_delete((void *)graph._0_8_,
                              (long)graph.coder_.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 1);
            }
            if (bVar37) {
              bioparser::Parser<biosoup::Sequence>::Create<bioparser::FastqParser>
                        ((Parser<biosoup::Sequence> *)local_248,&local_268);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"[spoa::CreateParser] error: file ",0x21);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_268._M_dataplus._M_p,
                                   local_268._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar21," has unsupported format extension (valid extensions: .fasta, ",
                         0x3d);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar21,".fasta.gz, .fna, .fna.gz, .faa, .faa.gz, .fa, .fa.gz, .fastq, ",
                         0x3e);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar21,".fastq.gz, .fq, .fq.gz)",0x17);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
              std::ostream::put((char)poVar21);
              std::ostream::flush();
              local_248._0_8_ = (_func_int **)0x0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((_func_int **)local_248._0_8_ != (_func_int **)0x0) {
            spoa::AlignmentEngine::Create
                      ((AlignmentEngine *)&graph,local_1dc & 0xff,(int8_t)local_278,
                       (int8_t)local_1e0,(int8_t)local_1a8,(int8_t)local_238._M_head_impl,
                       (int8_t)local_1b0,(int8_t)local_26c);
            this = graph._0_8_;
            local_1f8[0]._M_head_impl = (Sequence *)0x0;
            local_208 = (undefined1  [16])0x0;
            (**(code **)(*(_func_int **)local_248._0_8_ + 0x10))
                      (&name,local_248._0_8_,0xffffffffffffffff,1);
            graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_1f8[0]._M_head_impl;
            local_1f8[0]._M_head_impl = (Sequence *)name.field_2._M_allocated_capacity;
            name.field_2._M_allocated_capacity = 0;
            graph._0_8_ = local_208._0_8_;
            graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_208._8_8_;
            local_208._0_8_ = name._M_dataplus._M_p;
            local_208._8_8_ = name._M_string_length;
            name._M_dataplus._M_p = (pointer)0x0;
            name._M_string_length = 0;
            std::
            vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
            ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                       *)&graph);
            std::
            vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
            ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                       *)&name);
            if (local_208._0_8_ == local_208._8_8_) {
              uVar30 = 0;
            }
            else {
              auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar45 = ZEXT1664((undefined1  [16])0x0);
              uVar27 = 0;
              auVar42 = vpbroadcastq_avx512f();
              auVar42 = vpsrlq_avx512f(auVar42,3);
              do {
                auVar43 = vpbroadcastq_avx512f();
                auVar44 = vmovdqa64_avx512f(auVar45);
                auVar45 = vporq_avx512f(auVar43,auVar41);
                uVar35 = vpcmpuq_avx512f(auVar45,auVar42,2);
                vmovdqu64_avx512f(*(undefined1 (*) [64])(local_208._0_8_ + uVar27 * 8));
                uVar27 = uVar27 + 8;
                auVar45 = vpgatherqq_avx512f(this);
                auVar43._8_8_ = (ulong)((byte)(uVar35 >> 1) & 1) * auVar45._8_8_;
                auVar43._0_8_ = (ulong)((byte)uVar35 & 1) * auVar45._0_8_;
                auVar43._16_8_ = (ulong)((byte)(uVar35 >> 2) & 1) * auVar45._16_8_;
                auVar43._24_8_ = (ulong)((byte)(uVar35 >> 3) & 1) * auVar45._24_8_;
                auVar43._32_8_ = (ulong)((byte)(uVar35 >> 4) & 1) * auVar45._32_8_;
                auVar43._40_8_ = (ulong)((byte)(uVar35 >> 5) & 1) * auVar45._40_8_;
                auVar43._48_8_ = (ulong)((byte)(uVar35 >> 6) & 1) * auVar45._48_8_;
                auVar43._56_8_ = (uVar35 >> 7) * auVar45._56_8_;
                auVar45 = vpmaxuq_avx512f(auVar44,auVar43);
              } while ((((ulong)(local_208._8_8_ + (-8 - local_208._0_8_)) >> 3) + 8 &
                       0xfffffffffffffff8) != uVar27);
              auVar41 = vmovdqa64_avx512f(auVar45);
              bVar37 = (bool)((byte)uVar35 & 1);
              auVar42._0_8_ = (ulong)bVar37 * auVar41._0_8_ | (ulong)!bVar37 * auVar44._0_8_;
              bVar37 = (bool)((byte)(uVar35 >> 1) & 1);
              auVar42._8_8_ = (ulong)bVar37 * auVar41._8_8_ | (ulong)!bVar37 * auVar44._8_8_;
              bVar37 = (bool)((byte)(uVar35 >> 2) & 1);
              auVar42._16_8_ = (ulong)bVar37 * auVar41._16_8_ | (ulong)!bVar37 * auVar44._16_8_;
              bVar37 = (bool)((byte)(uVar35 >> 3) & 1);
              auVar42._24_8_ = (ulong)bVar37 * auVar41._24_8_ | (ulong)!bVar37 * auVar44._24_8_;
              bVar37 = (bool)((byte)(uVar35 >> 4) & 1);
              auVar42._32_8_ = (ulong)bVar37 * auVar41._32_8_ | (ulong)!bVar37 * auVar44._32_8_;
              bVar37 = (bool)((byte)(uVar35 >> 5) & 1);
              auVar42._40_8_ = (ulong)bVar37 * auVar41._40_8_ | (ulong)!bVar37 * auVar44._40_8_;
              bVar37 = (bool)((byte)(uVar35 >> 6) & 1);
              auVar42._48_8_ = (ulong)bVar37 * auVar41._48_8_ | (ulong)!bVar37 * auVar44._48_8_;
              auVar42._56_8_ =
                   (uVar35 >> 7) * auVar41._56_8_ | (ulong)!SUB81(uVar35 >> 7,0) * auVar44._56_8_;
              auVar40 = vextracti64x4_avx512f(auVar42,1);
              auVar41 = vpmaxuq_avx512f(auVar42,ZEXT3264(auVar40));
              auVar38 = vpmaxuq_avx512vl(auVar41._0_16_,auVar41._16_16_);
              auVar39 = vpshufd_avx(auVar38,0xee);
              auVar39 = vpmaxuq_avx512vl(auVar38,auVar39);
              uVar30 = auVar39._0_8_;
            }
            (**(code **)(*(long *)this + 0x10))(this,uVar30,4);
            spoa::Graph::Graph(&graph);
            uVar30 = local_208._8_8_;
            local_230 = (undefined1  [8])0x0;
            local_228 = (pointer)((ulong)local_228 & 0xffffffff00000000);
            local_220 = (_Bit_type *******)0x0;
            local_218 = 0;
            local_210 = (_Bit_pointer)0x0;
            _Var33._M_head_impl =
                 (gzFile_s *)
                 results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            puVar1 = results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (local_208._0_8_ != local_208._8_8_) {
              puVar29 = (pointer)local_208._0_8_;
              do {
                _score = (undefined4 *)((ulong)_score & 0xffffffff00000000);
                name.field_2._M_allocated_capacity = 0;
                name._M_dataplus._M_p = (pointer)0x0;
                name._M_string_length = 0;
                spoa::AlignmentEngine::Align
                          ((Alignment *)&path,(AlignmentEngine *)this,
                           &((puVar29->_M_t).
                             super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                             .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)->data,
                           &graph,&score);
                uVar10 = name.field_2._M_allocated_capacity;
                name.field_2._M_allocated_capacity =
                     (size_type)
                     path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                _Var5._M_p = name._M_dataplus._M_p;
                path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                name._M_dataplus._M_p =
                     (pointer)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                name._M_string_length =
                     (size_type)
                     path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                if (_Var5._M_p != (pointer)0x0) {
                  operator_delete(_Var5._M_p,uVar10 - (long)_Var5._M_p);
                  if (path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(path.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)path.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)path.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                if (bVar8) {
                  biosoup::Sequence::ReverseAndComplement
                            ((puVar29->_M_t).
                             super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                             .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl);
                  _score_rev = (undefined4 *)((ulong)_score_rev & 0xffffffff00000000);
                  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  spoa::AlignmentEngine::Align
                            ((Alignment *)&headers,(AlignmentEngine *)this,
                             &((puVar29->_M_t).
                               super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                               .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)->
                              data,&graph,&score_rev);
                  pbVar11 = headers.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  puVar9 = path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                  puVar26 = path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  headers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)headers.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       (pointer)headers.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)pbVar11;
                  headers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  headers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  if (puVar26 != (pointer)0x0) {
                    operator_delete(puVar26,(long)puVar9 - (long)puVar26);
                    if (headers.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(headers.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)headers.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)headers.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  iVar13 = score;
                  iVar16 = score_rev;
                  if (score < score_rev) {
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    operator=((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &name,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     *)&path);
                  }
                  else {
                    biosoup::Sequence::ReverseAndComplement
                              ((puVar29->_M_t).
                               super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                               .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl);
                  }
                  std::vector<bool,_std::allocator<bool>_>::push_back
                            ((vector<bool,_std::allocator<bool>_> *)local_230,iVar13 < iVar16);
                  if (path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(path.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)path.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)path.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                pSVar4 = (puVar29->_M_t).
                         super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                         .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl;
                if ((pSVar4->quality)._M_string_length == 0) {
                  spoa::Graph::AddAlignment(&graph,(Alignment *)&name,&pSVar4->data,1);
                }
                else {
                  spoa::Graph::AddAlignment
                            (&graph,(Alignment *)&name,&pSVar4->data,&pSVar4->quality);
                }
                if (name._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete(name._M_dataplus._M_p,
                                  name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
                }
                puVar29 = puVar29 + 1;
                _Var33._M_head_impl =
                     (gzFile_s *)
                     results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                puVar1 = results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              } while (puVar29 != (pointer)uVar30);
            }
            do {
              puVar12 = results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              if (_Var33._M_head_impl ==
                  (gzFile_s *)
                  results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = puVar1;
                spoa::Graph::PrintDot(&graph,&dot_path);
                iVar17 = 0;
                if (local_230 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_230,(long)local_210 - (long)local_230);
                  local_230 = (undefined1  [8])0x0;
                  local_228 = (pointer)((ulong)local_228 & 0xffffffff00000000);
                }
                spoa::Graph::~Graph(&graph);
                std::
                vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                           *)local_208);
                (**(code **)(*(long *)this + 8))();
                if ((_func_int **)local_248._0_8_ != (_func_int **)0x0) {
                  (**(code **)(*(_func_int **)local_248._0_8_ + 8))();
                }
                goto LAB_00104377;
              }
              gVar3 = *_Var33._M_head_impl;
              local_238._M_head_impl = _Var33._M_head_impl;
              if ((byte)gVar3 - 1 < 2) {
                results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = puVar1;
                spoa::Graph::GenerateMultipleSequenceAlignment_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&path,&graph,gVar3 == (gzFile_s)0x2);
                if (path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  uVar27 = 0;
                  uVar35 = 1;
                  do {
                    if (uVar27 < (ulong)((long)(local_208._8_8_ - local_208._0_8_) >> 3)) {
                      pSVar4 = (((pointer)(local_208._0_8_ + uVar27 * 8))->_M_t).
                               super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                               .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl;
                      name._M_dataplus._M_p = (pointer)&name.field_2;
                      _Var5._M_p = (pSVar4->name)._M_dataplus._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&name,_Var5._M_p,
                                 _Var5._M_p + (pSVar4->name)._M_string_length);
                    }
                    else {
                      name._M_dataplus._M_p = (pointer)&name.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&name,"Consensus","");
                    }
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">",1);
                    poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,name._M_dataplus._M_p,
                                         name._M_string_length);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21)
                    ;
                    std::ostream::put((char)poVar21);
                    poVar21 = (ostream *)std::ostream::flush();
                    poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar21,*(char **)(path.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  uVar27 * 8),
                                         *(long *)(path.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  uVar27 * 8 + 2));
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21)
                    ;
                    std::ostream::put((char)poVar21);
                    std::ostream::flush();
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)name._M_dataplus._M_p != &name.field_2) {
                      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
                    }
                    bVar37 = uVar35 < (ulong)((long)path.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)path.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5);
                    uVar27 = uVar35;
                    uVar35 = (ulong)((int)uVar35 + 1);
                  } while (bVar37);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&path);
                _Var33._M_head_impl = local_238._M_head_impl;
              }
              else if ((byte)gVar3 - 3 < 2) {
                uVar30 = local_208._8_8_;
                headers.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                headers.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                headers.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = puVar1;
                for (puVar29 = (pointer)local_208._0_8_; puVar29 != (pointer)uVar30;
                    puVar29 = puVar29 + 1) {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &headers,&((puVar29->_M_t).
                                        super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                                        .super__Head_base<0UL,_biosoup::Sequence_*,_false>.
                                       _M_head_impl)->name);
                }
                spoa::Graph::GenerateConsensus_abi_cxx11_(&local_50,&graph);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                lVar28 = 0x29;
                pcVar31 = "[spoa::PrintGfa] error: missing header(s)";
                uVar27 = (long)graph.sequences_.
                               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)graph.sequences_.
                               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3;
                if ((ulong)((long)headers.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)headers.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar27) {
LAB_00104aaa:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar31,lVar28);
                  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
                  std::ostream::put('(');
                  std::ostream::flush();
                }
                else {
                  gVar3 = *_Var33._M_head_impl;
                  if (local_230 != (undefined1  [8])local_220 || local_218 != 0) {
                    lVar28 = 0x31;
                    pcVar31 = "[spoa::PringGfa] error: missing reversion flag(s)";
                    if ((ulong)local_218 + ((long)local_220 - (long)local_230) * 8 < uVar27)
                    goto LAB_00104aaa;
                  }
                  auVar39[0xf] = 0;
                  auVar39._0_15_ =
                       (undefined1  [15])
                       path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._1_15_;
                  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._0_16_ = auVar39 << 8;
                  std::vector<bool,_std::allocator<bool>_>::vector
                            ((vector<bool,_std::allocator<bool>_> *)&name,
                             (long)graph.nodes_.
                                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)graph.nodes_.
                                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&path,
                             (allocator_type *)&score);
                  if (graph.consensus_.
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                      graph.consensus_.
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    ppNVar20 = graph.consensus_.
                               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    do {
                      pNVar22 = *ppNVar20;
                      ppNVar20 = ppNVar20 + 1;
                      *(ulong *)(name._M_dataplus._M_p + (ulong)(pNVar22->id >> 6) * 8) =
                           *(ulong *)(name._M_dataplus._M_p + (ulong)(pNVar22->id >> 6) * 8) |
                           1L << ((ulong)pNVar22->id & 0x3f);
                    } while (ppNVar20 !=
                             graph.consensus_.
                             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"H\tVN:Z:1.0",10);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                  std::ostream::put(' ');
                  std::ostream::flush();
                  puVar14 = graph.nodes_.
                            super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  _Var33._M_head_impl = local_238._M_head_impl;
                  for (puVar32 = graph.nodes_.
                                 super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      local_238._M_head_impl = _Var33._M_head_impl, puVar32 != puVar14;
                      puVar32 = puVar32 + 1) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"S\t",2);
                    poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\t",1);
                    path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start._0_1_ =
                         (char)graph.decoder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start
                               [(byte)((puVar32->_M_t).
                                       super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                                       .super__Head_base<0UL,_spoa::Graph::Node_*,_false>.
                                      _M_head_impl)->code];
                    std::__ostream_insert<char,std::char_traits<char>>(poVar21,(char *)&path,1);
                    uVar19 = ((puVar32->_M_t).
                              super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                              .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)->id;
                    if ((*(ulong *)(name._M_dataplus._M_p + (ulong)(uVar19 >> 6) * 8) >>
                         ((ulong)uVar19 & 0x3f) & 1) != 0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\tic:Z:true",10);
                    }
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                    std::ostream::put(' ');
                    std::ostream::flush();
                    pNVar22 = (puVar32->_M_t).
                              super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                              .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
                    ppEVar6 = *(pointer *)
                               ((long)&(pNVar22->outedges).
                                       super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                               + 8);
                    for (ppEVar36 = *(pointer *)
                                     &(pNVar22->outedges).
                                      super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                      ._M_impl; ppEVar36 != ppEVar6; ppEVar36 = ppEVar36 + 1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"L\t",2);
                      poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\t",1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar21,"+\t",2);
                      poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\t",1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar21,"+\t",2);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar21,"OM\t",3);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar21,"ew:f:",5);
                      std::ostream::_M_insert<long>((long)poVar21);
                      uVar19 = ((puVar32->_M_t).
                                super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                                .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)->id
                      ;
                      if (((*(ulong *)(name._M_dataplus._M_p + (ulong)(uVar19 >> 6) * 8) >>
                            ((ulong)uVar19 & 0x3f) & 1) != 0) &&
                         (uVar19 = (*ppEVar36)->head->id,
                         (*(ulong *)(name._M_dataplus._M_p + (ulong)(uVar19 >> 6) * 8) >>
                          ((ulong)uVar19 & 0x3f) & 1) != 0)) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"\tic:Z:true",10);
                      }
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                      std::ostream::put(' ');
                      std::ostream::flush();
                    }
                    _Var33._M_head_impl = local_238._M_head_impl;
                  }
                  if (graph.sequences_.
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish !=
                      graph.sequences_.
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
                    uVar27 = 0;
                    do {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"P\t",2);
                      poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           headers.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar27].
                                           _M_dataplus._M_p,
                                           headers.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar27].
                                           _M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\t",1);
                      path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x0;
                      pNVar22 = graph.sequences_.
                                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar27];
                      do {
                        uVar19 = pNVar22->id + 1;
                        _score = (undefined4 *)CONCAT44(uStack_184,uVar19);
                        if (path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish ==
                            path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&path,(iterator)
                                           path.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,(uint *)&score
                                    );
                        }
                        else {
                          *path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish = uVar19;
                          path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                        pNVar22 = spoa::Graph::Node::Successor(pNVar22,(uint32_t)uVar27);
                      } while (pNVar22 != (Node *)0x0);
                      if (((local_230 != (undefined1  [8])local_220) ||
                          (pcVar31 = "+", local_218 != 0)) &&
                         (pcVar31 = "+",
                         ((ulong)*(_Bit_type *******)((long)local_230 + (uVar27 >> 6) * 8) >>
                          (uVar27 & 0x3f) & 1) != 0)) {
                        pcVar31 = "-";
                        puVar26 = path.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + -1;
                        puVar7 = path.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        if (path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start < puVar26 &&
                            path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start !=
                            path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish) {
                          do {
                            puVar23 = puVar7 + 1;
                            uVar19 = *puVar7;
                            *puVar7 = *puVar26;
                            *puVar26 = uVar19;
                            puVar26 = puVar26 + -1;
                            puVar7 = puVar23;
                          } while (puVar23 < puVar26);
                          pcVar31 = "-";
                        }
                      }
                      if (path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish !=
                          path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start) {
                        uVar19 = 1;
                        do {
                          if (uVar19 != 1) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,",",1);
                          }
                          poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar21,pcVar31,1);
                          uVar35 = (ulong)uVar19;
                          uVar19 = uVar19 + 1;
                        } while (uVar35 < (ulong)((long)path.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)path.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2));
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\t*",2);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                      std::ostream::put(' ');
                      std::ostream::flush();
                      _Var33._M_head_impl = local_238._M_head_impl;
                      if (path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(path.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)path.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)path.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      uVar27 = (ulong)((uint32_t)uVar27 + 1);
                    } while (uVar27 < (ulong)((long)graph.sequences_.
                                                                                                        
                                                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)graph.sequences_.
                                                                                                        
                                                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
                  }
                  if (gVar3 == (gzFile_s)0x4) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"P\tConsensus\t",0xc);
                    if (graph.consensus_.
                        super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish !=
                        graph.consensus_.
                        super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      uVar27 = 1;
                      do {
                        if ((int)uVar27 != 1) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,",",1);
                        }
                        poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar21,"+",1);
                        bVar37 = uVar27 < (ulong)((long)graph.consensus_.
                                                                                                                
                                                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)graph.consensus_.
                                                                                                                
                                                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3);
                        uVar27 = (ulong)((int)uVar27 + 1);
                      } while (bVar37);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"\t*",2);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                    std::ostream::put(' ');
                    std::ostream::flush();
                  }
                  if (name._M_dataplus._M_p != (pointer)0x0) {
                    operator_delete(name._M_dataplus._M_p,local_288 - (long)name._M_dataplus._M_p);
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&headers);
              }
              else {
                results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = puVar1;
                if (gVar3 == (gzFile_s)0x0) {
                  spoa::Graph::GenerateConsensus_abi_cxx11_(&name,&graph,local_1e4);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,">Consensus LN:i:",0x10);
                  poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
                  std::ostream::put((char)poVar21);
                  poVar21 = (ostream *)std::ostream::flush();
                  poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar21,name._M_dataplus._M_p,name._M_string_length);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
                  std::ostream::put((char)poVar21);
                  std::ostream::flush();
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)name._M_dataplus._M_p != &name.field_2) {
                    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              _Var33._M_head_impl = _Var33._M_head_impl + 1;
              puVar1 = results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar12;
            } while( true );
          }
        }
        goto switchD_001037ea_caseD_66;
      }
      local_1e4 = atoi(_optarg);
      bVar37 = bVar8;
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  std::int8_t m = 5;
  std::int8_t n = -4;
  std::int8_t g = -8;
  std::int8_t e = -6;
  std::int8_t q = -10;
  std::int8_t c = -4;

  std::int32_t min_coverage = -1;

  std::uint8_t algorithm = 0;
  std::vector<std::uint8_t> results = { 0 };
  std::string dot_path{};
  bool is_strand_ambiguous = false;

  std::string optstr = "m:n:g:e:q:c:l:r:d:sh";
  int opt;
  while ((opt = getopt_long(argc, argv, optstr.c_str(), options, nullptr)) != -1) {  // NOLINT
    switch (opt) {
      case 'm': m = atoi(optarg); break;
      case 'n': n = atoi(optarg); break;
      case 'g': g = atoi(optarg); break;
      case 'e': e = atoi(optarg); break;
      case 'q': q = atoi(optarg); break;
      case 'c': c = atoi(optarg); break;
      case 'M': min_coverage = atoi(optarg); break;
      case 'l': algorithm = atoi(optarg); break;
      case 'r': results.emplace_back(atoi(optarg)); break;
      case 'd': dot_path = optarg; break;
      case 's': is_strand_ambiguous = true; break;
      case 'v': std::cout << spoa::Version() << std::endl; return 0;
      case 'h': Help(); return 0;
      default: return 1;
    }
  }
  if (results.size() > 1) {
    results.erase(results.begin());
  }

  if (optind >= argc) {
    std::cerr << "[spoa::] error: missing input file!" << std::endl;
    Help();
    return 1;
  }

  auto sparser = CreateParser(argv[optind]);
  if (sparser == nullptr) {
    return 1;
  }

  std::unique_ptr<spoa::AlignmentEngine> alignment_engine;
  try {
    alignment_engine = spoa::AlignmentEngine::Create(
        static_cast<spoa::AlignmentType>(algorithm), m, n, g, e, q, c);
  } catch(std::invalid_argument& exception) {
    std::cerr << exception.what() << std::endl;
    return 1;
  }

  std::vector<std::unique_ptr<biosoup::Sequence>> sequences;
  sequences = sparser->Parse(-1);

  std::size_t max_sequence_len = 0;
  for (const auto& it : sequences) {
    max_sequence_len = std::max(max_sequence_len, it->data.size());
  }
  try {
    alignment_engine->Prealloc(max_sequence_len, 4);
  } catch (std::invalid_argument& exception) {
    std::cerr << exception.what() << std::endl;
    return 1;
  }

  spoa::Graph graph{};
  std::vector<bool> is_reversed;
  for (const auto& it : sequences) {
    std::int32_t score = 0;
    spoa::Alignment alignment;
    try {
      alignment = alignment_engine->Align(it->data, graph, &score);
    } catch (std::invalid_argument& exception) {
      std::cerr << exception.what() << std::endl;
      return 1;
    }

    if (is_strand_ambiguous) {
      it->ReverseAndComplement();
      std::int32_t score_rev = 0;
      spoa::Alignment alignment_rev;
      try {
        alignment_rev = alignment_engine->Align(it->data, graph, &score_rev);
      } catch (std::invalid_argument& exception) {
        std::cerr << exception.what() << std::endl;
        return 1;
      }
      if (score >= score_rev) {
        it->ReverseAndComplement();
        is_reversed.push_back(false);
      } else {
        alignment = alignment_rev;
        is_reversed.push_back(true);
      }
    }

    try {
      if (it->quality.empty()) {
        graph.AddAlignment(alignment, it->data);
      } else {
        graph.AddAlignment(alignment, it->data, it->quality);
      }
    } catch(std::invalid_argument& exception) {
      std::cerr << exception.what() << std::endl;
      return 1;
    }
  }

  for (const auto& it : results) {
    switch (it) {
      case 0: {
        auto consensus = graph.GenerateConsensus(min_coverage);
        std::cout << ">Consensus LN:i:" << consensus.size() << std::endl
                  << consensus << std::endl;
        break;
      }
      case 1:
      case 2: {
        auto msa = graph.GenerateMultipleSequenceAlignment(it == 2);
        for (std::uint32_t i = 0; i < msa.size(); ++i) {
          std::string name = i < sequences.size() ? sequences[i]->name : "Consensus";  // NOLINT
          std::cout << ">" << name << std::endl
                    << msa[i] << std::endl;
        }
        break;
      }
      case 3:
      case 4: {
        std::vector<std::string> headers;
        for (const auto& it : sequences) {
          headers.emplace_back(it->name);
        }
        graph.GenerateConsensus();
        PrintGfa(graph, headers, is_reversed, it == 4);
        break;
      }
      default:
        break;
    }
  }

  graph.PrintDot(dot_path);

  return 0;
}